

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O1

void __thiscall cornerstone::peer::send_req(peer *this,ptr<req_msg> *req,rpc_handler *handler)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ptr<rpc_result> pending;
  rpc_handler h;
  async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>
  *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  peer *local_68;
  element_type *peStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined8 *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  local_78 = (async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>
              *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<cornerstone::rpc_exception>>,std::allocator<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<cornerstone::rpc_exception>>>,std::function<void(std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>const&)>&>
            (&local_70,&local_78,
             (allocator<cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<cornerstone::rpc_exception>_>_>
              *)&local_68,handler);
  peStack_60 = (req->super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58 = (req->super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  uStack_50 = local_78;
  local_48 = local_70._M_pi;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38 = (undefined8 *)0x0;
  uStack_30 = 0;
  local_68 = this;
  local_38 = (undefined8 *)operator_new(0x28);
  p_Var4 = local_48;
  *local_38 = local_68;
  local_38[1] = peStack_60;
  local_38[2] = 0;
  uVar2 = (undefined4)local_58;
  uVar3 = local_58._4_4_;
  peStack_60 = (element_type *)0x0;
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)(local_38 + 2) = uVar2;
  *(undefined4 *)((long)local_38 + 0x14) = uVar3;
  *(undefined4 *)(local_38 + 3) = (undefined4)uStack_50;
  *(undefined4 *)((long)local_38 + 0x1c) = uStack_50._4_4_;
  local_38[4] = 0;
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38[4] = p_Var4;
  pcStack_20 = std::
               _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/peer.cxx:24:21)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/peer.cxx:24:21)>
             ::_M_manager;
  peVar1 = (this->rpc_).super___shared_ptr<cornerstone::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_rpc_client[2])(peVar1,req);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  return;
}

Assistant:

void peer::send_req(ptr<req_msg>& req, rpc_handler& handler)
{
    ptr<rpc_result> pending = cs_new<rpc_result>(handler);
    rpc_handler h = [this, req, pending](ptr<resp_msg>& resp, const ptr<rpc_exception>& ex) mutable
    { this->handle_rpc_result(req, pending, resp, ex); };
    rpc_->send(req, h);
}